

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

_Bool trans_MRS_reg(DisasContext_conflict1 *s,arg_MRS_reg *a)

{
  TCGContext_conflict1 *s_00;
  TCGTemp *pTVar1;
  TCGv_i32 var;
  uint uVar2;
  TCGTemp *local_30;
  
  uVar2 = (uint)s->features;
  if ((uVar2 >> 9 & 1) == 0) {
    s_00 = s->uc->tcg_ctx;
    if (a->r == 0) {
      pTVar1 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
      var = (TCGv_i32)((long)pTVar1 - (long)s_00);
      local_30 = (TCGTemp *)(s_00->cpu_env + (long)s_00);
      tcg_gen_callN_aarch64(s_00,helper_cpsr_read_aarch64,pTVar1,1,&local_30);
    }
    else {
      if (s->user != 0) {
        unallocated_encoding_aarch64(s);
        goto LAB_00659f98;
      }
      pTVar1 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
      var = (TCGv_i32)((long)pTVar1 - (long)s_00);
      tcg_gen_op3_aarch64(s_00,INDEX_op_ld_i32,(TCGArg)pTVar1,(TCGArg)(s_00->cpu_env + (long)s_00),
                          0x158);
    }
    store_reg(s,a->rd,var);
  }
LAB_00659f98:
  return (uVar2 >> 9 & 1) == 0;
}

Assistant:

static bool trans_MRS_reg(DisasContext *s, arg_MRS_reg *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tmp;

    if (arm_dc_feature(s, ARM_FEATURE_M)) {
        return false;
    }
    if (a->r) {
        if (IS_USER(s)) {
            unallocated_encoding(s);
            return true;
        }
        tmp = load_cpu_field(tcg_ctx, spsr);
    } else {
        tmp = tcg_temp_new_i32(tcg_ctx);
        gen_helper_cpsr_read(tcg_ctx, tmp, tcg_ctx->cpu_env);
    }
    store_reg(s, a->rd, tmp);
    return true;
}